

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_coding.c
# Opt level: O2

int main(void)

{
  int iVar1;
  uint8_t decoded [3];
  uint8_t msg [3];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint64_t local_d8 [16];
  long local_58;
  
  local_198 = 0;
  local_190 = 0x5910f04084d75;
  local_188 = 0x5910f04084d75;
  local_170 = 0;
  local_180 = 0;
  uStack_178 = 0;
  local_168 = 0x5910f04084d75;
  local_160 = 0x5910f04084d75;
  local_158 = 0x5910f04084d75;
  local_150 = 0;
  local_148 = 0x5910f04084d75;
  local_140 = 0;
  uStack_138 = 0;
  local_130 = 0x5910f04084d75;
  local_128 = 0x5910f04084d75;
  local_120 = 0x5910f04084d75;
  local_118 = 0x5910f04084d75;
  local_110 = 0x5910f04084d75;
  local_108 = 0;
  local_100 = 0x5910f04084d75;
  local_f8 = 0;
  msg[0] = 'c';
  msg[1] = 0xa7;
  msg[2] = 0xd4;
  local_f0 = 0x5910f04084d75;
  local_e8 = 0;
  uStack_e0 = 0;
  iVar1 = encode(msg,local_d8,0x18,0xb221e08109aeb);
  if ((((iVar1 == 0) && (iVar1 = bcmp(local_d8,&local_198,0xc0), iVar1 == 0)) &&
      (iVar1 = decode(local_d8,decoded,0x18,0xb221e08109aeb), iVar1 == 0)) &&
     (iVar1 = bcmp(decoded,msg,3), iVar1 == 0)) {
    memset(local_d8,0,0xc0);
    decoded[0] = '\0';
    decoded[1] = '\0';
    decoded[2] = '\0';
    iVar1 = encode(msg,local_d8,0xf,0xb221e08109aeb);
    if (((iVar1 == 0) && (iVar1 = bcmp(local_d8,&local_198,0x78), iVar1 == 0)) &&
       ((local_58 == 0 &&
        ((iVar1 = decode(local_d8,decoded,0xf,0xb221e08109aeb), iVar1 == 0 &&
         (msg._0_2_ = msg._0_2_ & 0xfeff, decoded._0_2_ == msg._0_2_)))))) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int main() {

    uint64_t q = 3133737123486443;
    uint64_t q_half = 1566868561743221;
    size_t l = 3*8;
    uint8_t msg[3];
    uint64_t encoded[l];
    uint8_t decoded[3];

    // test encode / decode with 3 byte message

    msg[0] = 0x63;
    msg[1] = 0xA7;
    msg[2] = 0xD4;
    uint64_t encoded_cmp[] = {0, q_half, q_half, 0, 0, 0, q_half, q_half, q_half, 0, q_half, 0, 0, q_half, q_half, q_half, q_half, q_half ,0, q_half, 0, q_half, 0, 0};

    if(encode(msg, encoded, l, q) != 0)
        goto error;

    if(memcmp(encoded, encoded_cmp, l * sizeof(uint64_t)) != 0)
        goto error;

    if(decode(encoded, decoded, l, q) != 0)
        goto error;

    if(memcmp(decoded, msg, 3) != 0)
        goto error;

    // now test with an odd number of bits

    memset(encoded, 0, l * sizeof(uint64_t));
    memset(decoded, 0, 3);

    if(encode(msg, encoded, 15, q) != 0)
        goto error;

    if(memcmp(encoded, encoded_cmp, 15 * sizeof(uint64_t)) != 0 || encoded[16] != 0)
        goto error;

    if(decode(encoded, decoded, 15, q) != 0)
        goto error;

    msg[1] &= 0xFE;
    if(memcmp(decoded, msg, 2) != 0)
        goto error;

    return 0;


    error:
        return 1;

}